

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void __thiscall wasm::Literal::Literal(Literal *this,shared_ptr<wasm::GCData> *gcData,HeapType type)

{
  element_type *this_00;
  bool bVar1;
  HeapType local_30;
  HeapType type_local;
  
  local_30.id = type.id;
  std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this,
             &gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>);
  wasm::Type::Type(&this->type,type,
                   (uint)((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr == (element_type *)0x0),Inexact);
  bVar1 = wasm::Type::isData(&this->type);
  if ((((bVar1) &&
       ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0)) ||
      ((bVar1 = HeapType::isMaybeShared(&local_30,ext), bVar1 &&
       ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0)))) ||
     ((bVar1 = HeapType::isBottom(&local_30), bVar1 &&
      ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
       (element_type *)0x0)))) {
    return;
  }
  bVar1 = HeapType::isMaybeShared(&local_30,any);
  if ((bVar1) &&
     ((this_00 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      this_00 != (element_type *)0x0 &&
      (bVar1 = HeapType::isMaybeShared(&this_00->type,string), bVar1)))) {
    return;
  }
  __assert_fail("(isData() && gcData) || (type.isMaybeShared(HeapType::ext) && gcData) || (type.isBottom() && !gcData) || (type.isMaybeShared(HeapType::any) && gcData && gcData->type.isMaybeShared(HeapType::string))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x54,"wasm::Literal::Literal(std::shared_ptr<GCData>, HeapType)");
}

Assistant:

Literal::Literal(std::shared_ptr<GCData> gcData, HeapType type)
  : gcData(gcData), type(type, gcData ? NonNullable : Nullable) {
  // TODO: Use exact types for gcData.
  // The type must be a proper type for GC data: either a struct, array, or
  // string; or an externalized version of the same; or a null; or an
  // internalized string (which appears as an anyref).
  assert((isData() && gcData) ||
         (type.isMaybeShared(HeapType::ext) && gcData) ||
         (type.isBottom() && !gcData) ||
         (type.isMaybeShared(HeapType::any) && gcData &&
          gcData->type.isMaybeShared(HeapType::string)));
}